

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  sqlite3 *db_00;
  u8 uVar1;
  int iVar2;
  int iVar3;
  Table *pTVar4;
  void *pvVar5;
  Column *pCVar6;
  Expr *pEVar7;
  char *pcVar8;
  char *zArg1;
  char *local_e0;
  char *zDbTrig;
  char *zDb;
  int code;
  int iTabDb;
  DbFixer sFix;
  Token *pName;
  int iDb;
  sqlite3 *db;
  char *zName;
  Table *pTab;
  Trigger *pTrigger;
  IdList *pColumns_local;
  int op_local;
  int tr_tm_local;
  Token *pName2_local;
  Token *pName1_local;
  Parse *pParse_local;
  
  pTab = (Table *)0x0;
  db = (sqlite3 *)0x0;
  db_00 = pParse->db;
  pTrigger = (Trigger *)pColumns;
  if (isTemp == 0) {
    pName._4_4_ = sqlite3TwoPartName(pParse,pName1,pName2,&sFix.pName);
    if (pName._4_4_ < 0) goto LAB_00191c5e;
  }
  else {
    if (pName2->n != 0) {
      sqlite3ErrorMsg(pParse,"temporary trigger may not have qualified name");
      goto LAB_00191c5e;
    }
    pName._4_4_ = 1;
    sFix.pName = pName1;
  }
  if ((pTableName != (SrcList *)0x0) && (db_00->mallocFailed == '\0')) {
    if (((db_00->init).busy != '\0') && (pName._4_4_ != 1)) {
      sqlite3DbFree(db_00,pTableName->a[0].zDatabase);
      pTableName->a[0].zDatabase = (char *)0x0;
    }
    pTVar4 = sqlite3SrcListLookup(pParse,pTableName);
    if (((((db_00->init).busy == '\0') && (pName2->n == 0)) && (pTVar4 != (Table *)0x0)) &&
       (pTVar4->pSchema == db_00->aDb[1].pSchema)) {
      pName._4_4_ = 1;
    }
    if (db_00->mallocFailed == '\0') {
      sqlite3FixInit((DbFixer *)&code,pParse,pName._4_4_,"trigger",sFix.pName);
      iVar2 = sqlite3FixSrcList((DbFixer *)&code,pTableName);
      if (iVar2 == 0) {
        pTVar4 = sqlite3SrcListLookup(pParse,pTableName);
        if (pTVar4 != (Table *)0x0) {
          if (pTVar4->eTabType == '\x01') {
            sqlite3ErrorMsg(pParse,"cannot create triggers on virtual tables");
          }
          else if (((pTVar4->tabFlags & 0x1000) == 0) ||
                  (iVar2 = sqlite3ReadOnlyShadowTables(db_00), iVar2 == 0)) {
            db = (sqlite3 *)sqlite3NameFromToken(db_00,sFix.pName);
            if ((db == (sqlite3 *)0x0) ||
               (iVar2 = sqlite3CheckObjectName(pParse,(char *)db,"trigger",pTVar4->zName),
               iVar2 != 0)) goto LAB_00191c5e;
            if ((pParse->eParseMode < 2) &&
               (pvVar5 = sqlite3HashFind(&(db_00->aDb[pName._4_4_].pSchema)->trigHash,(char *)db),
               pvVar5 != (void *)0x0)) {
              if (noErr == 0) {
                sqlite3ErrorMsg(pParse,"trigger %T already exists",sFix.pName);
              }
              else {
                sqlite3CodeVerifySchema(pParse,pName._4_4_);
              }
              goto LAB_00191c5e;
            }
            iVar2 = sqlite3_strnicmp(pTVar4->zName,"sqlite_",7);
            if (iVar2 == 0) {
              sqlite3ErrorMsg(pParse,"cannot create trigger on system table");
              goto LAB_00191c5e;
            }
            if ((pTVar4->eTabType == '\x02') && (tr_tm != 0x41)) {
              pcVar8 = "AFTER";
              if (tr_tm == 0x21) {
                pcVar8 = "BEFORE";
              }
              sqlite3ErrorMsg(pParse,"cannot create %s trigger on view: %S",pcVar8,pTableName->a);
            }
            else {
              if ((pTVar4->eTabType == '\x02') || (tr_tm != 0x41)) {
                if (pParse->eParseMode < 2) {
                  iVar2 = sqlite3SchemaToIndex(db_00,pTVar4->pSchema);
                  zDb._0_4_ = 7;
                  pcVar8 = db_00->aDb[iVar2].zDbSName;
                  local_e0 = pcVar8;
                  if (isTemp != 0) {
                    local_e0 = db_00->aDb[1].zDbSName;
                  }
                  if ((iVar2 == 1) || (isTemp != 0)) {
                    zDb._0_4_ = 5;
                  }
                  iVar3 = sqlite3AuthCheck(pParse,(int)zDb,(char *)db,pTVar4->zName,local_e0);
                  if (iVar3 != 0) goto LAB_00191c5e;
                  zArg1 = "sqlite_master";
                  if (iVar2 == 1) {
                    zArg1 = "sqlite_temp_master";
                  }
                  iVar2 = sqlite3AuthCheck(pParse,0x12,zArg1,(char *)0x0,pcVar8);
                  if (iVar2 != 0) goto LAB_00191c5e;
                }
                pColumns_local._4_4_ = tr_tm;
                if (tr_tm == 0x41) {
                  pColumns_local._4_4_ = 0x21;
                }
                pTab = (Table *)sqlite3DbMallocZero(db_00,0x48);
                if (pTab != (Table *)0x0) {
                  pTab->zName = (char *)db;
                  db = (sqlite3 *)0x0;
                  pCVar6 = (Column *)sqlite3DbStrDup(db_00,pTableName->a[0].zName);
                  pTab->aCol = pCVar6;
                  *(Schema **)&pTab->tnum = db_00->aDb[pName._4_4_].pSchema;
                  *(Schema **)&pTab->tabFlags = pTVar4->pSchema;
                  *(u8 *)&pTab->pIndex = (u8)op;
                  uVar1 = '\x02';
                  if (pColumns_local._4_4_ == 0x21) {
                    uVar1 = '\x01';
                  }
                  *(u8 *)((long)&pTab->pIndex + 1) = uVar1;
                  if (pParse->eParseMode < 2) {
                    pEVar7 = sqlite3ExprDup(db_00,pWhen,1);
                    pTab->zColAff = (char *)pEVar7;
                  }
                  else {
                    sqlite3RenameTokenRemap(pParse,pTab->aCol,pTableName->a[0].zName);
                    pTab->zColAff = (char *)pWhen;
                    pWhen = (Expr *)0x0;
                  }
                  pTab->pCheck = (ExprList *)pColumns;
                  pTrigger = (Trigger *)0x0;
                  pParse->pNewTrigger = (Trigger *)pTab;
                }
                goto LAB_00191c5e;
              }
              sqlite3ErrorMsg(pParse,"cannot create INSTEAD OF trigger on table: %S",pTableName->a);
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"cannot create triggers on shadow tables");
          }
        }
        if ((db_00->init).iDb == '\x01') {
          (db_00->init).field_0x6 = (db_00->init).field_0x6 & 0xfe | 1;
        }
      }
    }
  }
LAB_00191c5e:
  sqlite3DbFree(db_00,db);
  sqlite3SrcListDelete(db_00,pTableName);
  sqlite3IdListDelete(db_00,(IdList *)pTrigger);
  sqlite3ExprDelete(db_00,pWhen);
  if (pParse->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(db_00,(Trigger *)pTab);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of the schema table
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    goto trigger_orphan_error;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_orphan_error;
  }
  if( (pTab->tabFlags & TF_Shadow)!=0 && sqlite3ReadOnlyShadowTables(db) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on shadow tables");
    goto trigger_orphan_error;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( zName==0 ){
    assert( db->mallocFailed );
    goto trigger_cleanup;
  }
  if( sqlite3CheckObjectName(pParse, zName, "trigger", pTab->zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( !IN_RENAME_OBJECT ){
    if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
        VVA_ONLY( pParse->ifNotExists = 1; )
      }
      goto trigger_cleanup;
    }
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( IsView(pTab) && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S",
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName->a);
    goto trigger_orphan_error;
  }
  if( !IsView(pTab) && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName->a);
    goto trigger_orphan_error;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    int iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zDbSName;
    const char *zDbTrig = isTemp ? db->aDb[1].zDbSName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenRemap(pParse, pTrigger->table, pTableName->a[0].zName);
    pTrigger->pWhen = pWhen;
    pWhen = 0;
  }else{
    pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  }
  pTrigger->pColumns = pColumns;
  pColumns = 0;
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
  return;

trigger_orphan_error:
  if( db->init.iDb==1 ){
    /* Ticket #3810.
    ** Normally, whenever a table is dropped, all associated triggers are
    ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
    ** and the table is dropped by a different database connection, the
    ** trigger is not visible to the database connection that does the
    ** drop so the trigger cannot be dropped.  This results in an
    ** "orphaned trigger" - a trigger whose associated table is missing.
    **
    ** 2020-11-05 see also https://sqlite.org/forum/forumpost/157dc791df
    */
    db->init.orphanTrigger = 1;
  }
  goto trigger_cleanup;
}